

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall ChainstateManager::ValidatedSnapshotCleanup(ChainstateManager *this)

{
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  bool bVar3;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_RDX;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *chainstate;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  anon_class_8_1_8991fb9c rename_failed_abort;
  path local_1d0 [3];
  string local_158;
  string local_138 [3];
  path local_c8;
  path tmp_old;
  optional<fs::path> snapshot_chainstate_path_maybe;
  optional<fs::path> ibd_chainstate_path_maybe;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ValidatedSnapshotCleanup()::$_0::operator()(&ibd_chainstate_path_maybe,(__0 *)this,in_RDX);
  ValidatedSnapshotCleanup()::$_0::operator()
            (&snapshot_chainstate_path_maybe,(__0 *)&this->m_snapshot_chainstate,chainstate);
  if ((((this->m_snapshot_chainstate)._M_t.
        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
      (_Var2._M_head_impl =
            (this->m_ibd_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
      _Var2._M_head_impl != (Chainstate *)0x0)) && ((_Var2._M_head_impl)->m_disabled != false)) {
    if ((ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
         super__Optional_payload<fs::path,_true,_false,_false>.
         super__Optional_payload_base<fs::path>._M_engaged == true) &&
       (snapshot_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
        super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>
        ._M_engaged != false)) {
      ResetChainstates(this);
      GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&tmp_old,this);
      if ((pointer)tmp_old.super_path._M_pathname._M_string_length !=
          tmp_old.super_path._M_pathname._M_dataplus._M_p) {
        __assert_fail("this->GetAll().size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1924,"bool ChainstateManager::ValidatedSnapshotCleanup()");
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&tmp_old);
      std::filesystem::__cxx11::path::string((string *)&tmp_old,(path *)&ibd_chainstate_path_maybe);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "ValidatedSnapshotCleanup";
      logging_function._M_len = 0x18;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x1927,ALL,Info,
                 "[snapshot] deleting background chainstate directory (now unnecessary) (%s)\n",
                 (string *)&tmp_old);
      std::__cxx11::string::~string((string *)&tmp_old);
      std::filesystem::__cxx11::path::path(&local_c8,(path *)&ibd_chainstate_path_maybe);
      fs::operator+(&tmp_old,(path *)&local_c8,"_todelete");
      std::filesystem::__cxx11::path::~path(&local_c8);
      std::filesystem::rename((path *)&ibd_chainstate_path_maybe,(path *)&tmp_old);
      std::filesystem::__cxx11::path::string(local_138,(path *)&snapshot_chainstate_path_maybe);
      std::filesystem::__cxx11::path::string(&local_158,(path *)&ibd_chainstate_path_maybe);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x57;
      logging_function_00._M_str = "ValidatedSnapshotCleanup";
      logging_function_00._M_len = 0x18;
      LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                (logging_function_00,source_file_00,0x1940,ALL,Info,
                 "[snapshot] moving snapshot chainstate (%s) to default chainstate directory (%s)\n"
                 ,local_138,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)local_138);
      std::filesystem::rename
                ((path *)&snapshot_chainstate_path_maybe,(path *)&ibd_chainstate_path_maybe);
      std::filesystem::__cxx11::path::path(local_1d0,&tmp_old.super_path);
      bVar3 = DeleteCoinsDBFromDisk((path *)local_1d0,false);
      std::filesystem::__cxx11::path::~path(local_1d0);
      if (bVar3) {
        std::filesystem::__cxx11::path::string(local_138,(path *)&ibd_chainstate_path_maybe);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x57;
        logging_function_01._M_str = "ValidatedSnapshotCleanup";
        logging_function_01._M_len = 0x18;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_01,source_file_01,0x1951,ALL,Info,
                   "[snapshot] deleted background chainstate directory (%s)\n",local_138);
      }
      else {
        std::filesystem::__cxx11::path::string(local_138,&tmp_old.super_path);
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x57;
        logging_function_03._M_str = "ValidatedSnapshotCleanup";
        logging_function_03._M_len = 0x18;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_03,source_file_03,0x194e,ALL,Info,
                   "Deletion of %s failed. Please remove it manually, as the directory is now unnecessary.\n"
                   ,local_138);
      }
      std::__cxx11::string::~string((string *)local_138);
      std::filesystem::__cxx11::path::~path(&tmp_old.super_path);
      bVar3 = true;
      goto LAB_008d0569;
    }
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_02._M_len = 0x57;
    logging_function_02._M_str = "ValidatedSnapshotCleanup";
    logging_function_02._M_len = 0x18;
    ::LogPrintf_<>(logging_function_02,source_file_02,0x1914,ALL,Info,
                   "[snapshot] snapshot chainstate cleanup cannot happen with in-memory chainstates. You are testing, right?\n"
                  );
  }
  bVar3 = false;
LAB_008d0569:
  std::_Optional_payload_base<fs::path>::_M_reset
            ((_Optional_payload_base<fs::path> *)&snapshot_chainstate_path_maybe);
  std::_Optional_payload_base<fs::path>::_M_reset
            ((_Optional_payload_base<fs::path> *)&ibd_chainstate_path_maybe);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::ValidatedSnapshotCleanup()
{
    AssertLockHeld(::cs_main);
    auto get_storage_path = [](auto& chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) -> std::optional<fs::path> {
        if (!(chainstate && chainstate->HasCoinsViews())) {
            return {};
        }
        return chainstate->CoinsDB().StoragePath();
    };
    std::optional<fs::path> ibd_chainstate_path_maybe = get_storage_path(m_ibd_chainstate);
    std::optional<fs::path> snapshot_chainstate_path_maybe = get_storage_path(m_snapshot_chainstate);

    if (!this->IsSnapshotValidated()) {
        // No need to clean up.
        return false;
    }
    // If either path doesn't exist, that means at least one of the chainstates
    // is in-memory, in which case we can't do on-disk cleanup. You'd better be
    // in a unittest!
    if (!ibd_chainstate_path_maybe || !snapshot_chainstate_path_maybe) {
        LogPrintf("[snapshot] snapshot chainstate cleanup cannot happen with "
                  "in-memory chainstates. You are testing, right?\n");
        return false;
    }

    const auto& snapshot_chainstate_path = *snapshot_chainstate_path_maybe;
    const auto& ibd_chainstate_path = *ibd_chainstate_path_maybe;

    // Since we're going to be moving around the underlying leveldb filesystem content
    // for each chainstate, make sure that the chainstates (and their constituent
    // CoinsViews members) have been destructed first.
    //
    // The caller of this method will be responsible for reinitializing chainstates
    // if they want to continue operation.
    this->ResetChainstates();

    // No chainstates should be considered usable.
    assert(this->GetAll().size() == 0);

    LogPrintf("[snapshot] deleting background chainstate directory (now unnecessary) (%s)\n",
              fs::PathToString(ibd_chainstate_path));

    fs::path tmp_old{ibd_chainstate_path + "_todelete"};

    auto rename_failed_abort = [this](
                                   fs::path p_old,
                                   fs::path p_new,
                                   const fs::filesystem_error& err) {
        LogError("[snapshot] Error renaming path (%s) -> (%s): %s\n",
                  fs::PathToString(p_old), fs::PathToString(p_new), err.what());
        GetNotifications().fatalError(strprintf(_(
            "Rename of '%s' -> '%s' failed. "
            "Cannot clean up the background chainstate leveldb directory."),
            fs::PathToString(p_old), fs::PathToString(p_new)));
    };

    try {
        fs::rename(ibd_chainstate_path, tmp_old);
    } catch (const fs::filesystem_error& e) {
        rename_failed_abort(ibd_chainstate_path, tmp_old, e);
        throw;
    }

    LogPrintf("[snapshot] moving snapshot chainstate (%s) to "
              "default chainstate directory (%s)\n",
              fs::PathToString(snapshot_chainstate_path), fs::PathToString(ibd_chainstate_path));

    try {
        fs::rename(snapshot_chainstate_path, ibd_chainstate_path);
    } catch (const fs::filesystem_error& e) {
        rename_failed_abort(snapshot_chainstate_path, ibd_chainstate_path, e);
        throw;
    }

    if (!DeleteCoinsDBFromDisk(tmp_old, /*is_snapshot=*/false)) {
        // No need to FatalError because once the unneeded bg chainstate data is
        // moved, it will not interfere with subsequent initialization.
        LogPrintf("Deletion of %s failed. Please remove it manually, as the "
                  "directory is now unnecessary.\n",
                  fs::PathToString(tmp_old));
    } else {
        LogPrintf("[snapshot] deleted background chainstate directory (%s)\n",
                  fs::PathToString(ibd_chainstate_path));
    }
    return true;
}